

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

void __thiscall llvm::APInt::APInt(APInt *this,APInt *that)

{
  uint uVar1;
  uint64_t *__dest;
  
  uVar1 = that->BitWidth;
  this->BitWidth = uVar1;
  if (uVar1 < 0x41) {
    this->U = that->U;
    return;
  }
  __dest = getMemory((uint)((ulong)this->BitWidth + 0x3f >> 6));
  (this->U).pVal = __dest;
  memcpy(__dest,(that->U).pVal,(ulong)((uint)((ulong)this->BitWidth + 0x3f >> 3) & 0xfffffff8));
  return;
}

Assistant:

APInt(const APInt &that) : BitWidth(that.BitWidth) {
    if (isSingleWord())
      U.VAL = that.U.VAL;
    else
      initSlowCase(that);
  }